

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall
asmjit::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,uint32_t type,uint32_t size)

{
  ZoneHeap *heap;
  size_t *psVar1;
  ulong uVar2;
  Error EVar3;
  RelocEntry *pRVar4;
  size_t sVar5;
  size_t sStack_38;
  
  sVar5 = (this->_relocations).super_ZoneVectorBase._length;
  heap = &this->_baseHeap;
  if ((this->_relocations).super_ZoneVectorBase._capacity == sVar5) {
    EVar3 = ZoneVectorBase::_grow(&(this->_relocations).super_ZoneVectorBase,heap,8,1);
    if (EVar3 != 0) {
      return EVar3;
    }
    sVar5 = (this->_relocations).super_ZoneVectorBase._length;
  }
  if (sVar5 >> 0x20 == 0) {
    if (heap->_zone == (Zone *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/zone.h"
                 ,0x198,"isInitialized()");
    }
    pRVar4 = (RelocEntry *)ZoneHeap::_allocZeroed(heap,0x20,&sStack_38);
    if (pRVar4 == (RelocEntry *)0x0) {
      EVar3 = 1;
    }
    else {
      pRVar4->_id = (uint32_t)sVar5;
      pRVar4->_type = (uint8_t)type;
      pRVar4->_size = (uint8_t)size;
      pRVar4->_sourceSectionId = 0xffffffff;
      pRVar4->_targetSectionId = 0xffffffff;
      uVar2 = (this->_relocations).super_ZoneVectorBase._length;
      if ((this->_relocations).super_ZoneVectorBase._capacity <= uVar2) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/zone.h"
                   ,0x2e3,"_length < _capacity");
      }
      *(RelocEntry **)((long)(this->_relocations).super_ZoneVectorBase._data + uVar2 * 8) = pRVar4;
      psVar1 = &(this->_relocations).super_ZoneVectorBase._length;
      *psVar1 = *psVar1 + 1;
      *dst = pRVar4;
      EVar3 = 0;
    }
  }
  else {
    EVar3 = 0x14;
  }
  return EVar3;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, uint32_t type, uint32_t size) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_baseHeap));

  size_t index = _relocations.getLength();
  if (ASMJIT_UNLIKELY(index > size_t(0xFFFFFFFFU)))
    return DebugUtils::errored(kErrorRelocIndexOverflow);

  RelocEntry* re = _baseHeap.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorNoHeapMemory);

  re->_id = static_cast<uint32_t>(index);
  re->_type = static_cast<uint8_t>(type);
  re->_size = static_cast<uint8_t>(size);
  re->_sourceSectionId = SectionEntry::kInvalidId;
  re->_targetSectionId = SectionEntry::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}